

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O3

void __thiscall icu_63::CanonicalIterator::cleanPieces(CanonicalIterator *this)

{
  UnicodeString *pUVar1;
  int iVar2;
  void *in_RSI;
  UnicodeString **buffer;
  long lVar3;
  long lVar4;
  
  buffer = this->pieces;
  if (buffer != (UnicodeString **)0x0) {
    iVar2 = this->pieces_length;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pUVar1 = this->pieces[lVar4];
        if (pUVar1 != (UnicodeString *)0x0) {
          lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
          if (lVar3 != 0) {
            lVar3 = lVar3 << 6;
            do {
              UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
              lVar3 = lVar3 + -0x40;
            } while (lVar3 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
          iVar2 = this->pieces_length;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
      buffer = this->pieces;
    }
    uprv_free_63(buffer);
    this->pieces = (UnicodeString **)0x0;
    this->pieces_length = 0;
  }
  if (this->pieces_lengths != (int32_t *)0x0) {
    uprv_free_63(this->pieces_lengths);
    this->pieces_lengths = (int32_t *)0x0;
  }
  if (this->current != (int32_t *)0x0) {
    uprv_free_63(this->current);
    this->current = (int32_t *)0x0;
    this->current_length = 0;
  }
  return;
}

Assistant:

void CanonicalIterator::cleanPieces() {
    int32_t i = 0;
    if(pieces != NULL) {
        for(i = 0; i < pieces_length; i++) {
            if(pieces[i] != NULL) {
                delete[] pieces[i];
            }
        }
        uprv_free(pieces);
        pieces = NULL;
        pieces_length = 0;
    }
    if(pieces_lengths != NULL) {
        uprv_free(pieces_lengths);
        pieces_lengths = NULL;
    }
    if(current != NULL) {
        uprv_free(current);
        current = NULL;
        current_length = 0;
    }
}